

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::interval_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::GreaterThanEquals,bool,true,false>
               (interval_t *ldata,interval_t *rdata,bool *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  ulong idx;
  int64_t *piVar10;
  ulong uVar11;
  ulong uVar12;
  idx_t idx_00;
  ulong idx_01;
  ulong uVar13;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    piVar10 = &rdata->micros;
    for (idx_00 = 0; count != idx_00; idx_00 = idx_00 + 1) {
      uVar3 = ((interval_t *)(piVar10 + -1))->months;
      uVar8 = ((interval_t *)(piVar10 + -1))->days;
      right_01.days = uVar8;
      right_01.months = uVar3;
      right_01.micros = *piVar10;
      bVar9 = BinarySingleArgumentOperatorWrapper::
              Operation<bool,duckdb::GreaterThanEquals,duckdb::interval_t,duckdb::interval_t,bool>
                        (fun,*ldata,right_01,mask,idx_00);
      result_data[idx_00] = bVar9;
      piVar10 = piVar10 + 2;
    }
  }
  else {
    idx_01 = 0;
    for (uVar11 = 0; uVar11 != count + 0x3f >> 6; uVar11 = uVar11 + 1) {
      puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        uVar13 = idx_01 + 0x40;
        if (count <= idx_01 + 0x40) {
          uVar13 = count;
        }
LAB_01329c4c:
        piVar10 = &rdata[idx_01].micros;
        for (; idx = idx_01, idx_01 < uVar13; idx_01 = idx_01 + 1) {
          uVar1 = ((interval_t *)(piVar10 + -1))->months;
          uVar6 = ((interval_t *)(piVar10 + -1))->days;
          right.days = uVar6;
          right.months = uVar1;
          right.micros = *piVar10;
          bVar9 = BinarySingleArgumentOperatorWrapper::
                  Operation<bool,duckdb::GreaterThanEquals,duckdb::interval_t,duckdb::interval_t,bool>
                            (fun,*ldata,right,mask,idx_01);
          result_data[idx_01] = bVar9;
          piVar10 = piVar10 + 2;
        }
      }
      else {
        uVar5 = puVar4[uVar11];
        uVar13 = idx_01 + 0x40;
        if (count <= idx_01 + 0x40) {
          uVar13 = count;
        }
        if (uVar5 == 0xffffffffffffffff) goto LAB_01329c4c;
        idx = uVar13;
        if (uVar5 != 0) {
          piVar10 = &rdata[idx_01].micros;
          for (uVar12 = 0; idx = idx_01 + uVar12, idx < uVar13; uVar12 = uVar12 + 1) {
            if ((uVar5 >> (uVar12 & 0x3f) & 1) != 0) {
              uVar2 = ((interval_t *)(piVar10 + -1))->months;
              uVar7 = ((interval_t *)(piVar10 + -1))->days;
              right_00.days = uVar7;
              right_00.months = uVar2;
              right_00.micros = *piVar10;
              bVar9 = BinarySingleArgumentOperatorWrapper::
                      Operation<bool,duckdb::GreaterThanEquals,duckdb::interval_t,duckdb::interval_t,bool>
                                (fun,*ldata,right_00,mask,idx);
              result_data[uVar12 + idx_01] = bVar9;
            }
            piVar10 = piVar10 + 2;
          }
        }
      }
      idx_01 = idx;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}